

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void jsonnet::internal::fodder_count
               (uint *column,Fodder *fodder,bool space_before,bool separate_token)

{
  bool bVar1;
  int iVar2;
  reference pFVar3;
  byte in_CL;
  byte in_DL;
  uint *in_RDI;
  FodderElement *fod;
  const_iterator __end2;
  const_iterator __begin2;
  Fodder *__range2;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  Kind in_stack_ffffffffffffffc4;
  __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  local_28 [2];
  byte local_12;
  byte local_11;
  uint *local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_8 = in_RDI;
  local_28[0]._M_current =
       (FodderElement *)
       std::
       vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
       begin(in_stack_ffffffffffffffb8);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  end(in_stack_ffffffffffffffb8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (__normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      if (((local_12 & 1) != 0) && ((local_11 & 1) != 0)) {
        *local_8 = *local_8 + 1;
      }
      return;
    }
    pFVar3 = __gnu_cxx::
             __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
             ::operator*(local_28);
    in_stack_ffffffffffffffc4 = pFVar3->kind;
    if (in_stack_ffffffffffffffc4 == LINE_END) {
LAB_002bc055:
      *local_8 = pFVar3->indent;
      local_11 = 0;
    }
    else if (in_stack_ffffffffffffffc4 == INTERSTITIAL) {
      if ((local_11 & 1) != 0) {
        *local_8 = *local_8 + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&pFVar3->comment,0);
      iVar2 = std::__cxx11::string::length();
      *local_8 = *local_8 + iVar2;
      local_11 = 1;
    }
    else if (in_stack_ffffffffffffffc4 == PARAGRAPH) goto LAB_002bc055;
    __gnu_cxx::
    __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
    ::operator++(local_28);
  } while( true );
}

Assistant:

static void fodder_count(unsigned &column, const Fodder &fodder, bool space_before,
                         bool separate_token)
{
    for (const auto &fod : fodder) {
        switch (fod.kind) {
            case FodderElement::PARAGRAPH:
            case FodderElement::LINE_END:
                column = fod.indent;
                space_before = false;
                break;

            case FodderElement::INTERSTITIAL:
                if (space_before)
                    column++;
                column += fod.comment[0].length();
                space_before = true;
                break;
        }
    }
    if (separate_token && space_before)
        column++;
}